

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_dr_flac__read_utf8_coded_number
                    (ma_dr_flac_bs *bs,ma_uint64 *pNumberOut,ma_uint8 *pCRCOut)

{
  ma_bool32 mVar1;
  uint uVar2;
  ma_result mVar3;
  byte *pResult;
  byte bVar4;
  ma_uint64 mVar5;
  long lStack_50;
  ma_uint8 utf8 [7];
  
  pResult = utf8;
  utf8[0] = '\0';
  utf8[1] = '\0';
  utf8[2] = '\0';
  utf8[3] = '\0';
  utf8[4] = '\0';
  utf8[5] = '\0';
  utf8[6] = '\0';
  bVar4 = *pCRCOut;
  mVar1 = ma_dr_flac__read_uint8(bs,8,utf8);
  if (mVar1 == 0) {
    *pNumberOut = 0;
LAB_00183f12:
    mVar3 = MA_AT_END;
  }
  else {
    bVar4 = ""[bVar4 ^ utf8[0]];
    uVar2 = (uint)utf8[0];
    if ((char)utf8[0] < '\0') {
      if ((uVar2 & 0xffffffe0) == 0xc0) {
        lStack_50 = 2;
      }
      else if ((uVar2 & 0xfffffff0) == 0xe0) {
        lStack_50 = 3;
      }
      else if ((uVar2 & 0xfffffff8) == 0xf0) {
        lStack_50 = 4;
      }
      else if ((uVar2 & 0xfffffffc) == 0xf8) {
        lStack_50 = 5;
      }
      else if ((uVar2 & 0xfffffffe) == 0xfc) {
        lStack_50 = 6;
      }
      else {
        if (uVar2 != 0xfe) {
          *pNumberOut = 0;
          return MA_CRC_MISMATCH;
        }
        lStack_50 = 7;
      }
      mVar5 = (ma_uint64)(0x7fU >> (sbyte)lStack_50 & uVar2);
      while( true ) {
        pResult = pResult + 1;
        lStack_50 = lStack_50 + -1;
        if (lStack_50 == 0) break;
        mVar1 = ma_dr_flac__read_uint8(bs,8,pResult);
        if (mVar1 == 0) {
          *pNumberOut = 0;
          goto LAB_00183f12;
        }
        bVar4 = ""[bVar4 ^ *pResult];
        mVar5 = mVar5 << 6 | (ulong)(*pResult & 0x3f);
      }
      *pNumberOut = mVar5;
      *pCRCOut = bVar4;
    }
    else {
      *pNumberOut = (ulong)uVar2;
      *pCRCOut = bVar4;
    }
    mVar3 = MA_SUCCESS;
  }
  return mVar3;
}

Assistant:

static ma_result ma_dr_flac__read_utf8_coded_number(ma_dr_flac_bs* bs, ma_uint64* pNumberOut, ma_uint8* pCRCOut)
{
    ma_uint8 crc;
    ma_uint64 result;
    ma_uint8 utf8[7] = {0};
    int byteCount;
    int i;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pNumberOut != NULL);
    MA_DR_FLAC_ASSERT(pCRCOut != NULL);
    crc = *pCRCOut;
    if (!ma_dr_flac__read_uint8(bs, 8, utf8)) {
        *pNumberOut = 0;
        return MA_AT_END;
    }
    crc = ma_dr_flac_crc8(crc, utf8[0], 8);
    if ((utf8[0] & 0x80) == 0) {
        *pNumberOut = utf8[0];
        *pCRCOut = crc;
        return MA_SUCCESS;
    }
    if ((utf8[0] & 0xE0) == 0xC0) {
        byteCount = 2;
    } else if ((utf8[0] & 0xF0) == 0xE0) {
        byteCount = 3;
    } else if ((utf8[0] & 0xF8) == 0xF0) {
        byteCount = 4;
    } else if ((utf8[0] & 0xFC) == 0xF8) {
        byteCount = 5;
    } else if ((utf8[0] & 0xFE) == 0xFC) {
        byteCount = 6;
    } else if ((utf8[0] & 0xFF) == 0xFE) {
        byteCount = 7;
    } else {
        *pNumberOut = 0;
        return MA_CRC_MISMATCH;
    }
    MA_DR_FLAC_ASSERT(byteCount > 1);
    result = (ma_uint64)(utf8[0] & (0xFF >> (byteCount + 1)));
    for (i = 1; i < byteCount; ++i) {
        if (!ma_dr_flac__read_uint8(bs, 8, utf8 + i)) {
            *pNumberOut = 0;
            return MA_AT_END;
        }
        crc = ma_dr_flac_crc8(crc, utf8[i], 8);
        result = (result << 6) | (utf8[i] & 0x3F);
    }
    *pNumberOut = result;
    *pCRCOut = crc;
    return MA_SUCCESS;
}